

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O1

void __thiscall ThreadPool::Stop(ThreadPool *this)

{
  pointer puVar1;
  unique_ptr<Thread,_std::default_delete<Thread>_> *item;
  pointer puVar2;
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  temp;
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  local_38;
  
  this->m_bRunning = false;
  Condition::NotifyAll(&this->m_notEmpty);
  puVar1 = (this->m_threads).
           super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_threads).
                super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Thread::Join((puVar2->_M_t).super___uniq_ptr_impl<Thread,_std::default_delete<Thread>_>._M_t.
                 super__Tuple_impl<0UL,_Thread_*,_std::default_delete<Thread>_>.
                 super__Head_base<0UL,_Thread_*,_false>._M_head_impl);
  }
  local_38.
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->m_threads).
       super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->m_threads).
       super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_threads).
       super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_threads).
  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void ThreadPool::Stop()
{
	m_bRunning = false;
	m_notEmpty.NotifyAll();
	for (std::unique_ptr<Thread> & item : m_threads)
	{
		item->Join();
	}
	
	std::vector<std::unique_ptr<Thread>> temp;
	m_threads.swap(temp);
}